

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__write_callbacks(uv_stream_t *stream)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  size_t sVar4;
  QUEUE *q;
  QUEUE pq;
  long *local_28;
  void *local_20;
  
  local_28 = (long *)stream->write_completed_queue[0];
  if (stream->write_completed_queue != (void **)local_28) {
    local_20 = stream->write_completed_queue[1];
    *(long ***)local_20 = &local_28;
    plVar2 = (long *)local_28[1];
    stream->write_completed_queue[1] = plVar2;
    *plVar2 = (long)stream->write_completed_queue;
    local_28[1] = (long)&local_28;
    while (plVar2 = local_28, &local_28 != (long **)local_28) {
      lVar3 = *local_28;
      *(long *)local_28[1] = lVar3;
      *(long *)(lVar3 + 8) = local_28[1];
      uVar1 = (stream->loop->active_reqs).count;
      if (uVar1 == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                      ,0x3b7,"void uv__write_callbacks(uv_stream_t *)");
      }
      (stream->loop->active_reqs).count = uVar1 - 1;
      if (local_28[3] != 0) {
        sVar4 = uv__count_bufs((uv_buf_t *)(local_28[3] + (ulong)*(uint *)(local_28 + 2) * 0x10),
                               (int)local_28[4] - *(uint *)(local_28 + 2));
        if (*(ulong *)(plVar2[-1] + 0x60) < sVar4) {
          __assert_fail("req->handle->write_queue_size >= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                        ,0x2d5,"size_t uv__write_req_size(uv_write_t *)");
        }
        stream->write_queue_size = stream->write_queue_size - sVar4;
        if ((long *)plVar2[3] != plVar2 + 5) {
          uv__free((long *)plVar2[3]);
        }
        plVar2[3] = 0;
      }
      if ((code *)plVar2[-3] != (code *)0x0) {
        (*(code *)plVar2[-3])(plVar2 + -0xb,*(undefined4 *)((long)plVar2 + 0x24));
      }
    }
  }
  return;
}

Assistant:

static void uv__write_callbacks(uv_stream_t* stream) {
  uv_write_t* req;
  QUEUE* q;
  QUEUE pq;

  if (QUEUE_EMPTY(&stream->write_completed_queue))
    return;

  QUEUE_MOVE(&stream->write_completed_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    /* Pop a req off write_completed_queue. */
    q = QUEUE_HEAD(&pq);
    req = QUEUE_DATA(q, uv_write_t, queue);
    QUEUE_REMOVE(q);
    uv__req_unregister(stream->loop, req);

    if (req->bufs != NULL) {
      stream->write_queue_size -= uv__write_req_size(req);
      if (req->bufs != req->bufsml)
        uv__free(req->bufs);
      req->bufs = NULL;
    }

    /* NOTE: call callback AFTER freeing the request data. */
    if (req->cb)
      req->cb(req, req->error);
  }
}